

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

bool testing::Test::IsSkipped(void)

{
  bool bVar1;
  TestResult *this;
  
  UnitTest::GetInstance();
  if ((UnitTest::GetInstance::instance.impl_)->current_test_info_ == (TestInfo *)0x0) {
    if ((UnitTest::GetInstance::instance.impl_)->current_test_case_ == (TestCase *)0x0) {
      this = &(UnitTest::GetInstance::instance.impl_)->ad_hoc_test_result_;
    }
    else {
      this = &(UnitTest::GetInstance::instance.impl_)->current_test_case_->ad_hoc_test_result_;
    }
  }
  else {
    this = &(UnitTest::GetInstance::instance.impl_)->current_test_info_->result_;
  }
  bVar1 = TestResult::Skipped(this);
  return bVar1;
}

Assistant:

bool Test::IsSkipped() {
  return internal::GetUnitTestImpl()->current_test_result()->Skipped();
}